

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteKeyMetadata
          (WalletBatch *this,CKeyMetadata *meta,CPubKey *pubkey,bool overwrite)

{
  byte bVar1;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *in_stack_ffffffffffffff48;
  undefined1 fOverwrite;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  fOverwrite = (undefined1)((ulong)local_70 >> 0x38);
  std::make_pair<std::__cxx11::string_const&,CPubKey_const&>
            (in_RDI,(CPubKey *)in_stack_ffffffffffffff48);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,wallet::CKeyMetadata>
                    ((WalletBatch *)CONCAT17(bVar1,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68,
                     (CKeyMetadata *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (bool)fOverwrite);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>::
  ~pair(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteKeyMetadata(const CKeyMetadata& meta, const CPubKey& pubkey, const bool overwrite)
{
    return WriteIC(std::make_pair(DBKeys::KEYMETA, pubkey), meta, overwrite);
}